

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O2

i32_t Kumu::base64decode(char *str,byte_t *buf,ui32_t buf_len,ui32_t *char_count)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  
  if (char_count == (ui32_t *)0x0 || (buf == (byte_t *)0x0 || str == (char *)0x0)) {
    return -1;
  }
  uVar5 = 0;
  uVar3 = 0;
  bVar4 = 0;
LAB_001169b4:
LAB_001169bb:
  do {
    uVar6 = uVar5;
    if (buf_len <= uVar3) {
LAB_00116a4d:
      *char_count = uVar3;
      return 0;
    }
    do {
      cVar1 = *str;
      if ((long)cVar1 == 0) goto LAB_00116a4d;
      str = str + 1;
      bVar2 = decode_map[cVar1];
    } while (bVar2 == 0xff);
    if (cVar1 == '=') goto LAB_00116a4d;
    uVar5 = uVar6 + 1;
  } while (3 < uVar6);
  switch(uVar6) {
  case 0:
    buf[uVar3] = bVar2 << 2;
    uVar5 = 1;
    break;
  case 1:
    goto switchD_001169f9_caseD_1;
  case 2:
    buf[uVar3] = bVar2 >> 2 | bVar4 << 4;
    uVar5 = 3;
    uVar3 = uVar3 + 1;
    bVar4 = bVar2;
    goto LAB_001169b4;
  case 3:
    buf[uVar3] = bVar2 | bVar4 << 6;
    uVar5 = 0;
  }
  uVar3 = uVar3 + 1;
  goto LAB_001169bb;
switchD_001169f9_caseD_1:
  buf[uVar3 - 1] = buf[uVar3 - 1] | bVar2 >> 4;
  uVar5 = 2;
  bVar4 = bVar2;
  goto LAB_001169b4;
}

Assistant:

i32_t
Kumu::base64decode(const char* str, byte_t* buf, ui32_t buf_len, ui32_t* char_count)
{
  byte_t c = 0, d = 0;
  ui32_t phase = 0, i = 0;

  if ( str == 0 || buf == 0 || char_count == 0 )
    return -1;

  while ( *str != 0 && i < buf_len )
    {
      c = decode_map[(int)*str++];
      if ( c == 0xff ) continue;
      if ( c == 0xfe ) break;

      switch ( phase++ )
	{
	case 0:
	  buf[i++] =  c << 2;
	  break;

	case 1:
	  buf[i - 1] |= c >> 4;
	  d = c;
	  break;

	case 2:
	  buf[i++] =  ( d << 4 ) | ( c >> 2 );
	  d = c;
	  break;

	case 3:
	  buf[i++] =  ( d << 6 ) | c;
	  phase = 0;
	  break;
	}
    }

  *char_count = i;
  return 0;
}